

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_auth_act(connectdata *conn)

{
  Curl_easy *data;
  _Bool _Var1;
  _Bool _Var2;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  
  data = conn->data;
  iVar4 = (data->req).httpcode;
  if (iVar4 - 100U < 100) {
    return CURLE_OK;
  }
  if ((data->state).authproblem == true) {
    if ((data->set).http_fail_on_error == false) {
      return CURLE_OK;
    }
    return CURLE_HTTP_RETURNED_ERROR;
  }
  if ((conn->bits).user_passwd == true) {
    if (iVar4 != 0x191) {
      _Var1 = false;
      if ((299 < iVar4) || (_Var1 = false, (conn->bits).authneg == false)) goto LAB_00513396;
    }
    _Var1 = pickoneauth(&(data->state).authhost);
    if (!_Var1) {
      (data->state).authproblem = true;
    }
  }
  else {
    _Var1 = false;
  }
LAB_00513396:
  if ((conn->bits).proxy_user_passwd == true) {
    iVar4 = (data->req).httpcode;
    if (((iVar4 == 0x197) || ((_Var2 = false, iVar4 < 300 && ((conn->bits).authneg != false)))) &&
       (_Var2 = pickoneauth(&(data->state).authproxy), !_Var2)) {
      (data->state).authproblem = true;
    }
  }
  else {
    _Var2 = false;
  }
  if ((_Var1 | _Var2) == 1) {
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    pcVar5 = (*Curl_cstrdup)((data->change).url);
    (data->req).newurl = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (((((data->set).httpreq | HTTPREQ_PUT) != HTTPREQ_HEAD) &&
        ((conn->bits).rewindaftersend == false)) &&
       (CVar3 = http_perhapsrewind(conn), CVar3 != CURLE_OK)) {
      return CVar3;
    }
  }
  else if (((((data->req).httpcode < 300) && ((data->state).authhost.done == false)) &&
           ((conn->bits).authneg == true)) && (((data->set).httpreq | HTTPREQ_PUT) != HTTPREQ_HEAD))
  {
    pcVar5 = (*Curl_cstrdup)((data->change).url);
    (data->req).newurl = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->state).authhost.done = true;
  }
  iVar4 = http_should_fail(conn);
  if (iVar4 == 0) {
    return CURLE_OK;
  }
  Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
  return CURLE_HTTP_RETURNED_ERROR;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if(conn->bits.user_passwd &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost);
    if(!pickhost)
      data->state.authproblem = TRUE;
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;

    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(conn);
      if(result)
        return result;
    }
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}